

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckArray2DCloseFailsOnNotEqual::~TestCheckArray2DCloseFailsOnNotEqual
          (TestCheckArray2DCloseFailsOnNotEqual *this)

{
  TestCheckArray2DCloseFailsOnNotEqual *this_local;
  
  ~TestCheckArray2DCloseFailsOnNotEqual(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckArray2DCloseFailsOnNotEqual)
{
    bool failure = false;
    {
        RecordingReporter reporter;
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);

		int const data1[2][2] = { {0, 1}, {2, 3} };
        int const data2[2][2] = { {0, 1}, {3, 3} };
        CHECK_ARRAY2D_CLOSE (data1, data2, 2, 2, 0.01f);

		failure = (testResults.GetFailureCount() > 0);
    }

    CHECK(failure);
}